

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O2

double dasum(int n,double *x,int incx)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  
  iVar1 = 0;
  if (0 < n) {
    iVar1 = n;
  }
  dVar3 = 0.0;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    dVar3 = dVar3 + ABS(*x);
    x = x + incx;
  }
  return dVar3;
}

Assistant:

double dasum ( int n, double x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DASUM takes the sum of the absolute values of a vector.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double X[*], the vector to be examined.
//
//    Input, int INCX, the increment between successive entries of X.
//    INCX must not be negative.
//
//    Output, double DASUM, the sum of the absolute values of X.
//
{
  int i;
  int j;
  double value;

  value = 0.0;
  j = 0;

  for ( i = 0; i < n; i++ )
  {
    value = value + fabs ( x[j] );
    j = j + incx;
  }

  return value;
}